

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O1

void __thiscall
BailOutRecord::RestoreValue
          (BailOutRecord *this,BailOutKind bailOutKind,JavascriptCallStackLayout *layout,Var *values
          ,ScriptContext *scriptContext,bool fromLoopBody,Var *registerSaves,
          InterpreterStackFrame *newInstance,Var *pArgumentsObject,void *argoutRestoreAddress,
          uint regSlot,int offset,bool isLocal,bool isFloat64,bool isInt32)

{
  IRType IVar1;
  Utf8SourceInfo *pUVar2;
  code *pcVar3;
  bool bVar4;
  RegNum RVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  int32 iVar9;
  RegSlot RVar10;
  LocalFunctionId LVar11;
  FunctionBody *pFVar12;
  undefined4 *puVar13;
  Var instance;
  undefined4 extraout_var;
  uint64 uVar14;
  uint64 uVar15;
  JavascriptCallStackLayout *extraout_RDX;
  JavascriptCallStackLayout *extraout_RDX_00;
  JavascriptCallStackLayout *extraout_RDX_01;
  JavascriptCallStackLayout *extraout_RDX_02;
  JavascriptCallStackLayout *layout_00;
  Var pvVar16;
  char16 *form;
  char16_t *pcVar17;
  ulong uVar18;
  Var local_60;
  ulong local_48;
  
  pcVar17 = L"OutParam";
  if (isLocal) {
    pcVar17 = L"Register";
  }
  if (DAT_015d346a == '\x01') {
    pFVar12 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(newInstance + 0x80));
    uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar12);
    pFVar12 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(newInstance + 0x80));
    if ((pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar4) goto LAB_003ff804;
      *puVar13 = 0;
    }
    bVar4 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015cd718,BailOutPhase,uVar7,
                       ((pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)
                       ->functionId);
    if ((bVar4) &&
       ((DAT_015d6388 == DAT_015d6390 ||
        (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_015d6368,bailOutKind), bVar4)))) {
      Output::Print(L"BailOut:   %s #%3d: ",pcVar17,(ulong)regSlot);
    }
  }
  if (offset < 0) {
    if (argoutRestoreAddress == (void *)0x0) {
      if (isFloat64) {
        local_60 = (Var)Js::JavascriptCallStackLayout::GetDoubleAtOffset(layout,offset);
        local_48 = 0;
      }
      else {
        if (!isInt32) {
          instance = Js::JavascriptCallStackLayout::GetOffset(layout,offset);
          pFVar12 = Js::JavascriptFunction::GetFunctionBody
                              (*(JavascriptFunction **)(newInstance + 0x80));
          pUVar2 = (pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
          if (((pUVar2->debugModeSource).ptr == (uchar *)0x0) && ((pUVar2->field_0xa8 & 0x20) == 0))
          {
            local_48 = 0;
            local_60 = (Var)0x0;
          }
          else {
            local_48 = 0;
            local_60 = (Var)0x0;
            if ((pUVar2->field_0xa8 & 0x40) != 0) {
              pFVar12 = Js::JavascriptFunction::GetFunctionBody
                                  (*(JavascriptFunction **)(newInstance + 0x80));
              bVar4 = Js::FunctionBody::IsNonTempLocalVar(pFVar12,regSlot);
              if ((instance == (Var)0xcececececececece) && (bVar4)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
                *puVar13 = 1;
                uVar7 = 0x379;
                goto LAB_003feeb2;
              }
            }
          }
          goto LAB_003feb03;
        }
        iVar9 = Js::JavascriptCallStackLayout::GetInt32AtOffset(layout,offset);
        local_48 = CONCAT44(extraout_var,iVar9);
        local_60 = (Var)0x0;
      }
LAB_003feb01:
      instance = (Var)0x0;
    }
    else {
      local_48 = 0;
      local_60 = (Var)0x0;
      if (isLocal) goto LAB_003feb01;
      if (isFloat64 || isInt32) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                           ,900,"(!isFloat64 && !isInt32)","!isFloat64 && !isInt32");
        if (!bVar4) goto LAB_003ff804;
        *puVar13 = 0;
      }
      instance = *(Var *)((long)argoutRestoreAddress + (ulong)(regSlot * 8));
      pFVar12 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      pUVar2 = (pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
      if ((((pUVar2->debugModeSource).ptr != (uchar *)0x0) || ((pUVar2->field_0xa8 & 0x20) != 0)) &&
         ((pUVar2->field_0xa8 & 0x40) != 0)) {
        pFVar12 = Js::JavascriptFunction::GetFunctionBody
                            (*(JavascriptFunction **)(newInstance + 0x80));
        bVar4 = Js::FunctionBody::IsNonTempLocalVar(pFVar12,regSlot);
        if (instance == (Var)0xcececececececece && bVar4) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          uVar7 = 0x38a;
LAB_003feeb2:
          local_48 = 0;
          local_60 = (Var)0x0;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                             ,uVar7,
                             "(!(newInstance->function->GetFunctionBody()->IsInDebugMode() && newInstance->function->GetFunctionBody()->IsNonTempLocalVar(regSlot) && value == (Js::Var)Func::c_debugFillPattern))"
                             ,
                             "Uninitialized value (debug mode only)? Try -trace:bailout -verbose and check last traced reg in byte code."
                            );
          if (!bVar4) goto LAB_003ff804;
          *puVar13 = 0;
          instance = (Var)0xcececececececece;
        }
      }
    }
LAB_003feb03:
    bVar4 = true;
    if (DAT_015d346a == '\x01') {
      pFVar12 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar12);
      pFVar12 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      if ((pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
          (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                           ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar4) goto LAB_003ff804;
        *puVar13 = 0;
      }
      bVar4 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_015cd718,BailOutPhase,uVar7,
                         ((pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.
                         ptr)->functionId);
      if ((bVar4) &&
         ((DAT_015d6388 == DAT_015d6390 ||
          (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_015d6368,bailOutKind), bVar4)))) {
        Output::Print(L"Stack offset %6d",(ulong)(uint)offset);
      }
LAB_003fedb1:
      bVar4 = true;
    }
  }
  else {
    if (offset == 0) {
      if (DAT_015d346a != '\x01') {
        return;
      }
      pFVar12 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar12);
      pFVar12 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      if ((pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
          (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                           ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar4) goto LAB_003ff804;
        *puVar13 = 0;
      }
      bVar4 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_015cd718,BailOutPhase,uVar7,
                         ((pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.
                         ptr)->functionId);
      if (!bVar4) {
        return;
      }
      form = L"Not live\n";
      goto LAB_003ff7bb;
    }
    uVar7 = GetBailOutRegisterSaveSlotCount();
    if ((uint)offset <= uVar7) {
      if (registerSaves == (Var *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                           ,0x396,"(registerSaves)","registerSaves");
        if (!bVar4) goto LAB_003ff804;
        *puVar13 = 0;
      }
      RVar5 = LinearScanMD::GetRegisterFromSaveIndex(offset);
      IVar1 = RegTypes[RVar5];
      if (!isFloat64) {
        if (isInt32) {
          if (IVar1 == TyFloat64) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar13 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                               ,0x3a6,
                               "(RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] != TyFloat64)"
                               ,
                               "RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] != TyFloat64"
                              );
            if (!bVar4) goto LAB_003ff804;
            *puVar13 = 0;
          }
          local_48 = (ulong)*(uint *)(registerSaves + ((ulong)(uint)offset - 1));
          instance = (Var)0x0;
        }
        else {
          if (IVar1 == TyFloat64) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar13 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                               ,0x3ab,
                               "(RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] != TyFloat64)"
                               ,
                               "RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] != TyFloat64"
                              );
            if (!bVar4) goto LAB_003ff804;
            *puVar13 = 0;
          }
          instance = registerSaves[(ulong)(uint)offset - 1];
          local_48 = 0;
        }
        bVar4 = true;
        local_60 = (Var)0x0;
        if (DAT_015d346a == '\x01') {
          pFVar12 = Js::JavascriptFunction::GetFunctionBody
                              (*(JavascriptFunction **)(newInstance + 0x80));
          uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar12);
          pFVar12 = Js::JavascriptFunction::GetFunctionBody
                              (*(JavascriptFunction **)(newInstance + 0x80));
          if ((pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
              (FunctionInfo *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar13 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                               ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
            if (!bVar4) goto LAB_003ff804;
            *puVar13 = 0;
          }
          bVar4 = Js::Phases::IsEnabled
                            ((Phases *)&DAT_015cd718,BailOutPhase,uVar7,
                             ((pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.
                              functionInfo.ptr)->functionId);
          if ((bVar4) &&
             ((DAT_015d6388 == DAT_015d6390 ||
              (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_015d6368,bailOutKind), bVar4)))) {
            RVar5 = LinearScanMD::GetRegisterFromSaveIndex(offset);
            Output::Print(L"Register %-4S  %4d",RegNames[RVar5],(ulong)(uint)offset);
          }
          goto LAB_003fedb1;
        }
        goto LAB_003feee1;
      }
      if (IVar1 != TyFloat64) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                           ,0x39a,
                           "(RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] == TyFloat64)"
                           ,"RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] == TyFloat64")
        ;
        if (!bVar4) goto LAB_003ff804;
        *puVar13 = 0;
      }
      local_60 = registerSaves[(ulong)(uint)offset - 1];
      bVar4 = true;
      if (DAT_015d346a != '\x01') {
        local_48 = 0;
        instance = (void *)0x0;
        goto LAB_003feee1;
      }
      pFVar12 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar12);
      pFVar12 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      if ((pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
          (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                           ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar4) goto LAB_003ff804;
        *puVar13 = 0;
      }
      bVar4 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_015cd718,BailOutPhase,uVar7,
                         ((pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.
                         ptr)->functionId);
      if ((bVar4) &&
         ((DAT_015d6388 == DAT_015d6390 ||
          (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_015d6368,bailOutKind), bVar4)))) {
        RVar5 = LinearScanMD::GetRegisterFromSaveIndex(offset);
        Output::Print(L"Register %-4S  %4d",RegNames[RVar5],(ulong)(uint)offset);
      }
      local_48 = 0;
      instance = (Var)0x0;
      goto LAB_003fedb1;
    }
    uVar7 = GetBailOutRegisterSaveSlotCount();
    uVar8 = GetBailOutReserveSlotCount();
    if (uVar8 + uVar7 == offset) {
      layout_00 = extraout_RDX;
      if (isFloat64) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                           ,0x3b4,"(!isFloat64)","!isFloat64");
        if (!bVar4) goto LAB_003ff804;
        *puVar13 = 0;
        layout_00 = extraout_RDX_00;
      }
      if (isInt32) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                           ,0x3b5,"(!isInt32)","!isInt32");
        if (!bVar4) goto LAB_003ff804;
        *puVar13 = 0;
        layout_00 = extraout_RDX_01;
      }
      if (fromLoopBody) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                           ,0x3b6,"(!fromLoopBody)","!fromLoopBody");
        if (!bVar4) goto LAB_003ff804;
        *puVar13 = 0;
        layout_00 = extraout_RDX_02;
      }
      instance = *pArgumentsObject;
      if (instance == (Var)0x0) {
        instance = EnsureArguments(this,newInstance,layout_00,scriptContext,pArgumentsObject);
      }
      if (instance == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                           ,0x3bc,"(value)","value");
        if (!bVar4) goto LAB_003ff804;
        *puVar13 = 0;
      }
      local_48 = 0;
      if (DAT_015d346a != '\x01') {
LAB_003fea64:
        local_60 = (Var)0x0;
        bVar4 = false;
        goto LAB_003feee1;
      }
      pFVar12 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar12);
      pFVar12 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      if ((pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
          (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                           ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar4) goto LAB_003ff804;
        *puVar13 = 0;
      }
      bVar4 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_015cd718,BailOutPhase,uVar7,
                         ((pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.
                         ptr)->functionId);
      local_48 = 0;
      if (bVar4) {
        if ((DAT_015d6388 == DAT_015d6390) ||
           (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_015d6368,bailOutKind), bVar4)) {
          Output::Print(L"Arguments object");
        }
        local_48 = 0;
      }
    }
    else {
      uVar7 = GetBailOutRegisterSaveSlotCount();
      uVar8 = GetBailOutReserveSlotCount();
      uVar18 = (ulong)(~(uVar8 + uVar7) + offset);
      local_48 = 0;
      if (isInt32) {
        local_48 = (ulong)this->constants[uVar18] & 0xffffffff;
      }
      instance = (Var)0x0;
      if (!isInt32) {
        instance = this->constants[uVar18];
      }
      if (DAT_015d346a == '\x01') {
        pFVar12 = Js::JavascriptFunction::GetFunctionBody
                            (*(JavascriptFunction **)(newInstance + 0x80));
        uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar12);
        pFVar12 = Js::JavascriptFunction::GetFunctionBody
                            (*(JavascriptFunction **)(newInstance + 0x80));
        if ((pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
            (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                             ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar4) goto LAB_003ff804;
          *puVar13 = 0;
        }
        bVar4 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_015cd718,BailOutPhase,uVar7,
                           ((pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.
                           ptr)->functionId);
        if (bVar4) {
          if ((DAT_015d6388 == DAT_015d6390) ||
             (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_015d6368,bailOutKind), bVar4)) {
            Output::Print(L"Constant index %4d",uVar18);
          }
          goto LAB_003fea64;
        }
      }
    }
    local_60 = (Var)0x0;
    bVar4 = false;
  }
LAB_003feee1:
  if (isFloat64) {
    uVar14 = Js::NumberUtilities::ToSpecial((double)local_60);
    bVar4 = Js::NumberUtilities::IsNan((double)local_60);
    if (((bVar4) &&
        (uVar15 = Js::NumberUtilities::ToSpecial((double)local_60), uVar15 != 0xfff8000000000000))
       && (uVar15 = Js::NumberUtilities::ToSpecial((double)local_60), uVar15 != 0x7ff8000000000000))
    {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Library/JavascriptNumber.inl"
                         ,0xa2,
                         "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                         ,"We should only produce a NaN with this value");
      if (!bVar4) goto LAB_003ff804;
      *puVar13 = 0;
    }
    pvVar16 = (Var)(uVar14 ^ 0xfffc000000000000);
    if (DAT_015d346a == '\x01') {
      pFVar12 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar12);
      pFVar12 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      if ((pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
          (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                           ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar4) goto LAB_003ff804;
        *puVar13 = 0;
      }
      bVar4 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_015cd718,BailOutPhase,uVar7,
                         ((pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.
                         ptr)->functionId);
      if ((bVar4) &&
         ((DAT_015d6388 == DAT_015d6390 ||
          (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_015d6368,bailOutKind), bVar4)))) {
        Output::Print(L", value: %f (ToVar: 0x%p)",local_60,pvVar16);
      }
    }
  }
  else if (isInt32) {
    if (instance != (void *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x3de,"(!value)","!value");
      if (!bVar4) goto LAB_003ff804;
      *puVar13 = 0;
    }
    pvVar16 = (Var)(local_48 & 0xffffffff | 0x1000000000000);
    if (DAT_015d346a == '\x01') {
      pFVar12 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar12);
      pFVar12 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      if ((pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
          (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                           ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar4) goto LAB_003ff804;
        *puVar13 = 0;
      }
      bVar4 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_015cd718,BailOutPhase,uVar7,
                         ((pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.
                         ptr)->functionId);
      if ((bVar4) &&
         ((DAT_015d6388 == DAT_015d6390 ||
          (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_015d6368,bailOutKind), bVar4)))) {
        Output::Print(L", value: %10d (ToVar: 0x%p)",local_48,pvVar16);
      }
    }
  }
  else {
    pFVar12 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(newInstance + 0x80));
    RVar10 = Js::FunctionBody::GetYieldRegister(pFVar12);
    pvVar16 = instance;
    if (RVar10 == regSlot) {
      pFVar12 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      if ((pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
          (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                           ,0x50d,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar6) goto LAB_003ff804;
        *puVar13 = 0;
      }
      if ((FunctionBody *)
          (((pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
          functionBodyImpl).ptr != pFVar12) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                           ,0x50e,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                           "GetFunctionInfo()->GetFunctionProxy() == this");
        if (!bVar6) goto LAB_003ff804;
        *puVar13 = 0;
      }
      if ((((pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->attributes
          & (Async|Generator)) != None) {
        if (instance == (void *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                             ,0x3e6,"(value)","value");
          if (!bVar4) goto LAB_003ff804;
          *puVar13 = 0;
        }
        bVar4 = ThreadContext::IsOnStack(instance);
        if (bVar4) {
          if (DAT_015d346a != '\0') {
            pFVar12 = Js::JavascriptFunction::GetFunctionBody
                                (*(JavascriptFunction **)(newInstance + 0x80));
            uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar12);
            pFVar12 = Js::JavascriptFunction::GetFunctionBody
                                (*(JavascriptFunction **)(newInstance + 0x80));
            LVar11 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar12);
            bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,BailOutPhase,uVar7,LVar11);
            if ((bVar4) &&
               ((DAT_015d6388 == DAT_015d6390 ||
                (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_015d6368,bailOutKind), bVar4))))
            {
              pcVar17 = L", value: 0x%p (Resume Yield Object)";
LAB_003ff6e0:
              Output::Print(pcVar17,instance);
            }
          }
        }
        else if (DAT_015d346a != '\0') {
          pFVar12 = Js::JavascriptFunction::GetFunctionBody
                              (*(JavascriptFunction **)(newInstance + 0x80));
          uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar12);
          pFVar12 = Js::JavascriptFunction::GetFunctionBody
                              (*(JavascriptFunction **)(newInstance + 0x80));
          LVar11 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar12);
          bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,BailOutPhase,uVar7,LVar11);
          if ((bVar4) &&
             ((DAT_015d6388 == DAT_015d6390 ||
              (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_015d6368,bailOutKind), bVar4)))) {
            pcVar17 = L", value: 0x%p (Yield Return Value)";
            goto LAB_003ff6e0;
          }
        }
        goto LAB_003ff6ea;
      }
    }
    if (DAT_015d346a == '\x01') {
      pFVar12 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar12);
      pFVar12 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      if ((pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
          (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                           ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar6) goto LAB_003ff804;
        *puVar13 = 0;
      }
      bVar6 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_015cd718,BailOutPhase,uVar7,
                         ((pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.
                         ptr)->functionId);
      if ((bVar6) &&
         ((DAT_015d6388 == DAT_015d6390 ||
          (bVar6 = Js::NumberSet::Contains((NumberSet *)&DAT_015d6368,bailOutKind), bVar6)))) {
        Output::Print(L", value: 0x%p",instance);
      }
    }
    if (((bVar4) &&
        (pvVar16 = Js::JavascriptOperators::BoxStackInstance(instance,scriptContext,true,false),
        instance != pvVar16)) && (DAT_015d346a == '\x01')) {
      pFVar12 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar12);
      pFVar12 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      if ((pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
          (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                           ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar4) goto LAB_003ff804;
        *puVar13 = 0;
      }
      bVar4 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_015cd718,BailOutPhase,uVar7,
                         ((pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.
                         ptr)->functionId);
      if ((bVar4) &&
         ((DAT_015d6388 == DAT_015d6390 ||
          (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_015d6368,bailOutKind), bVar4)))) {
        Output::Print(L" (Boxed: 0x%p)",pvVar16);
      }
    }
  }
LAB_003ff6ea:
  values[regSlot] = pvVar16;
  if (DAT_015d346a != '\x01') {
    return;
  }
  pFVar12 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(newInstance + 0x80));
  uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar12);
  pFVar12 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(newInstance + 0x80));
  if ((pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) {
LAB_003ff804:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar13 = 0;
  }
  bVar4 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015cd718,BailOutPhase,uVar7,
                     ((pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
                     functionId);
  if (!bVar4) {
    return;
  }
  form = L"\n";
LAB_003ff7bb:
  if ((DAT_015d6388 != DAT_015d6390) &&
     (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_015d6368,bailOutKind), !bVar4)) {
    return;
  }
  Output::Print(form);
  return;
}

Assistant:

void
BailOutRecord::RestoreValue(IR::BailOutKind bailOutKind, Js::JavascriptCallStackLayout * layout, Js::Var * values, Js::ScriptContext * scriptContext,
    bool fromLoopBody, Js::Var * registerSaves, Js::InterpreterStackFrame * newInstance, Js::Var* pArgumentsObject, void * argoutRestoreAddress,
    uint regSlot, int offset, bool isLocal, bool isFloat64, bool isInt32) const
{
    bool boxStackInstance = true;
    Js::Var value = 0;
    double dblValue = 0.0;
    int32 int32Value = 0;

#if ENABLE_DEBUG_CONFIG_OPTIONS
    char16 const * name = _u("OutParam");
    if (isLocal)
    {
        name = _u("Register");
    }
#endif

    BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("BailOut:   %s #%3d: "), name, regSlot);

    if (offset < 0)
    {
        // Stack offset are negative
        if (!argoutRestoreAddress)
        {
            if (isFloat64)
            {
                dblValue = layout->GetDoubleAtOffset(offset);
            }
            else if (isInt32)
            {
                int32Value = layout->GetInt32AtOffset(offset);
            }
            else
            {
                value = layout->GetOffset(offset);
                AssertMsg(!(newInstance->function->GetFunctionBody()->IsInDebugMode() &&
                    newInstance->function->GetFunctionBody()->IsNonTempLocalVar(regSlot) &&
                    value == (Js::Var)Func::c_debugFillPattern),
                    "Uninitialized value (debug mode only)? Try -trace:bailout -verbose and check last traced reg in byte code.");
            }
        }
        else if (!isLocal)
        {
            // If we have:
            // try {
            //      bar(a, b, c);
            // } catch(..) {..}
            // and we bailout during bar args evaluation, we recover from args from argoutRestoreAddress, not from caller function frame.
            // This is because try-catch is implemented as a C wrapper, so args will be a different offset from rbp in that case.
            Assert(!isFloat64 && !isInt32);

            value = *((Js::Var *)(((char *)argoutRestoreAddress) + regSlot * MachPtr));
            AssertMsg(!(newInstance->function->GetFunctionBody()->IsInDebugMode() &&
                newInstance->function->GetFunctionBody()->IsNonTempLocalVar(regSlot) &&
                value == (Js::Var)Func::c_debugFillPattern),
                "Uninitialized value (debug mode only)? Try -trace:bailout -verbose and check last traced reg in byte code.");

        }

        BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("Stack offset %6d"), offset);
    }
    else if (offset > 0)
    {
        if ((uint)offset <= GetBailOutRegisterSaveSlotCount())
        {
            // Register save space (offset is the register number and index into the register save space)
            // Index is one based, so subtract one
            AssertOrFailFast(registerSaves);

            if (isFloat64)
            {
                Assert(RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] == TyFloat64);
                dblValue = *((double*)&(registerSaves[offset - 1]));
#ifdef _M_ARM
                BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("Register %-4S  %4d"), RegNames[(offset - RegD0) / 2 + RegD0], offset);
#else
                BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("Register %-4S  %4d"), RegNames[LinearScanMD::GetRegisterFromSaveIndex(offset)], offset);
#endif
            }
            else
            {
                if (isInt32)
                {
                    Assert(RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] != TyFloat64);
                    int32Value = ::Math::PointerCastToIntegralTruncate<int32>(registerSaves[offset - 1]);
                }
                else
                {
                    Assert(RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] != TyFloat64);
                    value = registerSaves[offset - 1];
                }

                BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("Register %-4S  %4d"), RegNames[LinearScanMD::GetRegisterFromSaveIndex(offset)], offset);
            }
        }
        else if (BailOutRecord::IsArgumentsObject((uint)offset))
        {
            Assert(!isFloat64);
            Assert(!isInt32);
            Assert(!fromLoopBody);
            value = *pArgumentsObject;
            if (value == nullptr)
            {
                value = EnsureArguments(newInstance, layout, scriptContext, pArgumentsObject);
            }
            Assert(value);
            BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("Arguments object"));
            boxStackInstance = false;
        }
        else
        {
            // Constants offset starts from max bail out register save slot count;
            uint constantIndex = offset - (GetBailOutRegisterSaveSlotCount() + GetBailOutReserveSlotCount()) - 1;
            if (isInt32)
            {
                int32Value = ::Math::PointerCastToIntegralTruncate<int32>(this->constants[constantIndex]);
            }
            else
            {
                value = this->constants[constantIndex];
            }
            BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("Constant index %4d"), constantIndex);
            boxStackInstance = false;
        }
    }
    else
    {
        // Consider Assert(false) here
        BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("Not live\n"));
        return;
    }

    if (isFloat64)
    {
        value = Js::JavascriptNumber::New(dblValue, scriptContext);
        BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u(", value: %f (ToVar: 0x%p)"), dblValue, value);
    }
    else if (isInt32)
    {
        Assert(!value);
        value = Js::JavascriptNumber::ToVar(int32Value, scriptContext);
        BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u(", value: %10d (ToVar: 0x%p)"), int32Value, value);
    }
    else if (regSlot == newInstance->function->GetFunctionBody()->GetYieldRegister() && newInstance->function->GetFunctionBody()->IsCoroutine())
    {
        // This value can only either be a resume yield object created on the heap or
        // an iterator result object created on the heap. No need to box either.
        Assert(value);

#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (ThreadContext::IsOnStack(value))
        {
            BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u(", value: 0x%p (Resume Yield Object)"), value);
        }
        else
        {
            BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u(", value: 0x%p (Yield Return Value)"), value);
        }
#endif
    }
    else
    {
        BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u(", value: 0x%p"), value);
        if (boxStackInstance)
        {
            Js::Var oldValue = value;
            value = Js::JavascriptOperators::BoxStackInstance(oldValue, scriptContext, /* allowStackFunction */ true, /* deepCopy */ false);

            if (oldValue != value)
            {
                BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u(" (Boxed: 0x%p)"), value);
            }
        }
    }

    values[regSlot] = value;

    BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("\n"));
}